

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicInputICase2::Run(BasicInputICase2 *this)

{
  CallLogWrapper *this_00;
  IVec4 *pIVar1;
  UVec4 *pUVar2;
  long lVar3;
  GLuint index;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this_00 = &(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttribI4i(this_00,index,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui(this_00,index + 8,0,0,0,0);
    index = index + 1;
  } while (index != 8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x18,(void *)0x0,0x88e4);
  local_28 = 0x200000001;
  uStack_20._0_4_ = 3;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0xc,&local_28);
  local_28 = 0x500000004;
  uStack_20 = CONCAT44(uStack_20._4_4_,6);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0xc,&local_28);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,(void *)0x0,0x88e4);
  local_28 = 0x140000000a;
  uStack_20 = 0x280000001e;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x10,&local_28);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,3,0x1404,0);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,2,0x1404,4);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0xe,1,0x1405,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,2);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0xe,7);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xe);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,8);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,2,this->m_vbo[0],0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_vbo[1],4,0x10);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,0,1);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,2,0);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,7,2);
  (this->super_BasicInputIBase).instance_count = 2;
  (this->super_BasicInputIBase).expected_datai[0].m_data[0] = 1;
  (this->super_BasicInputIBase).expected_datai[0].m_data[1] = 2;
  (this->super_BasicInputIBase).expected_datai[0].m_data[2] = 3;
  (this->super_BasicInputIBase).expected_datai[0].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[2].m_data[0] = 2;
  (this->super_BasicInputIBase).expected_datai[2].m_data[1] = 3;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[2].m_data[2] = 0;
  pIVar1[2].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[6].m_data[0] = 0x14;
  (this->super_BasicInputIBase).expected_dataui[6].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[6].m_data[2] = 0;
  pUVar2[6].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[8].m_data[0] = 4;
  (this->super_BasicInputIBase).expected_datai[8].m_data[1] = 5;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[8].m_data[2] = 6;
  pIVar1[8].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[10].m_data[0] = 2;
  (this->super_BasicInputIBase).expected_datai[10].m_data[1] = 3;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[10].m_data[2] = 0;
  pIVar1[10].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[0xe].m_data[0] = 0x14;
  (this->super_BasicInputIBase).expected_dataui[0xe].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[0xe].m_data[2] = 0;
  pUVar2[0xe].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0x10].m_data[0] = 1;
  (this->super_BasicInputIBase).expected_datai[0x10].m_data[1] = 2;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0x10].m_data[2] = 3;
  pIVar1[0x10].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0x12].m_data[0] = 4;
  (this->super_BasicInputIBase).expected_datai[0x12].m_data[1] = 5;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0x12].m_data[2] = 0;
  pIVar1[0x12].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[0x16].m_data[0] = 0x14;
  (this->super_BasicInputIBase).expected_dataui[0x16].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[0x16].m_data[2] = 0;
  pUVar2[0x16].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0x18].m_data[0] = 4;
  (this->super_BasicInputIBase).expected_datai[0x18].m_data[1] = 5;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0x18].m_data[2] = 6;
  pIVar1[0x18].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0x1a].m_data[0] = 4;
  (this->super_BasicInputIBase).expected_datai[0x1a].m_data[1] = 5;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0x1a].m_data[2] = 0;
  pIVar1[0x1a].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_dataui[0x1e].m_data[0] = 0x14;
  (this->super_BasicInputIBase).expected_dataui[0x1e].m_data[1] = 0;
  pUVar2 = (this->super_BasicInputIBase).expected_dataui;
  pUVar2[0x1e].m_data[2] = 0;
  pUVar2[0x1e].m_data[3] = 1;
  lVar3 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(IVec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(IVec3), &IVec3(1, 2, 3)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(IVec3), &IVec3(4, 5, 6)[0]);

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(UVec4), NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(UVec4), &UVec4(10, 20, 30, 40)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribIFormat(0, 3, GL_INT, 0);
		glVertexAttribIFormat(2, 2, GL_INT, 4);
		glVertexAttribIFormat(14, 1, GL_UNSIGNED_INT, 0);
		glVertexAttribBinding(0, 2);
		glVertexAttribBinding(2, 0);
		glVertexAttribBinding(14, 7);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(14);
		glBindVertexBuffer(0, m_vbo[0], 0, 8);
		glBindVertexBuffer(2, m_vbo[0], 0, 12);
		glBindVertexBuffer(7, m_vbo[1], 4, 16);
		glVertexBindingDivisor(0, 1);
		glVertexBindingDivisor(2, 0);
		glVertexBindingDivisor(7, 2);

		instance_count		= 2;
		expected_datai[0]   = IVec4(1, 2, 3, 1);
		expected_datai[2]   = IVec4(2, 3, 0, 1);
		expected_dataui[6]  = UVec4(20, 0, 0, 1);
		expected_datai[8]   = IVec4(4, 5, 6, 1);
		expected_datai[10]  = IVec4(2, 3, 0, 1);
		expected_dataui[14] = UVec4(20, 0, 0, 1);

		expected_datai[16]  = IVec4(1, 2, 3, 1);
		expected_datai[18]  = IVec4(4, 5, 0, 1);
		expected_dataui[22] = UVec4(20, 0, 0, 1);
		expected_datai[24]  = IVec4(4, 5, 6, 1);
		expected_datai[26]  = IVec4(4, 5, 0, 1);
		expected_dataui[30] = UVec4(20, 0, 0, 1);
		return BasicInputIBase::Run();
	}